

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

Param * __thiscall
kratos::Generator::parameter(Generator *this,string *parameter_name,uint32_t width,bool is_signed)

{
  undefined1 local_50 [16];
  shared_ptr<kratos::Param> ptr;
  uint32_t width_local;
  bool is_signed_local;
  
  ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = width;
  ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       is_signed;
  check_param_name_conflict(this,parameter_name);
  local_50._0_8_ = this;
  std::make_shared<kratos::Param,kratos::Generator*,std::__cxx11::string_const&,unsigned_int&,bool&>
            ((Generator **)(local_50 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (uint *)parameter_name,
             (bool *)&ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Param>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>>
              *)&this->params_,parameter_name,(shared_ptr<kratos::Param> *)(local_50 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptr);
  return (Param *)local_50._8_8_;
}

Assistant:

Param &Generator::parameter(const std::string &parameter_name, uint32_t width, bool is_signed) {
    check_param_name_conflict(parameter_name);
    auto ptr = std::make_shared<Param>(this, parameter_name, width, is_signed);
    params_.emplace(parameter_name, ptr);
    return *ptr;
}